

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serialize.h
# Opt level: O2

Writer * __thiscall chatra::Writer::outPointer<chatra::Lock>(Writer *this,Lock *value)

{
  mapped_type *pmVar1;
  Writer *pWVar2;
  Lock *local_18;
  
  local_18 = value;
  pmVar1 = std::__detail::
           _Map_base<const_void_*,_std::pair<const_void_*const,_unsigned_long>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<const_void_*,_std::pair<const_void_*const,_unsigned_long>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&this->pointerMap,&local_18);
  pWVar2 = outRawInteger<unsigned_long>(this,*pmVar1);
  return pWVar2;
}

Assistant:

Writer& outPointer(const Type* value) {
		CHATRA_SAVE_TYPE_TAG(Pointer);
		chatra_assert(pointerMap.count(value) != 0);
		return out(pointerMap.at(value));
	}